

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void Diffusion::computeExtensiveFluxes
               (MLMG *a_mg,MultiFab *Soln,MultiFab **flux,int fluxComp,int ncomp,MultiFab *area,
               Real fac)

{
  EBCellFlagFab *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i;
  FabType FVar3;
  EBFArrayBoxFactory *this_00;
  int *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l;
  initializer_list<amrex::MultiFab_*> __l_00;
  long local_858;
  long local_850;
  Box wbx;
  Box vbx;
  Box ubx;
  Array4<double> local_7c8;
  Real local_788;
  FabArray<amrex::FArrayBox> *local_780;
  Array4<double> local_778;
  Array4<double> local_738;
  MultiCutFab *local_6f8;
  MultiCutFab *local_6f0;
  tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_6e8;
  FabArray<amrex::FArrayBox> *local_6e0;
  FabArray<amrex::FArrayBox> *local_6d8;
  MultiFab *local_6d0;
  Array4<double> local_6c8;
  Array4<double> local_688;
  Array4<double> local_648;
  Box bx;
  Box result;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  MFIter mfi;
  Array4<const_double> local_548;
  Array4<const_double> local_508;
  MFItInfo local_4c4;
  MultiFab flxz;
  MultiFab flxy;
  MultiFab flxx;
  
  local_788 = fac;
  local_780 = &area->super_FabArray<amrex::FArrayBox>;
  amrex::MultiFab::MultiFab(&flxx,*flux,make_alias,fluxComp,ncomp);
  amrex::MultiFab::MultiFab(&flxy,flux[1],make_alias,fluxComp,ncomp);
  amrex::MultiFab::MultiFab(&flxz,flux[2],make_alias,fluxComp,ncomp);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_738;
  local_738.p = (double *)&flxx;
  local_738.jstride = (Long)&flxy;
  local_738.kstride = (Long)&flxz;
  std::
  vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *)&mfi,__l,(allocator_type *)&local_688);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_778;
  local_778.p = (double *)Soln;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,__l_00,
             (allocator_type *)&local_6c8);
  amrex::MLMG::getFluxes
            (a_mg,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   *)&mfi,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8,
             FaceCentroid);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
            ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_7c8);
  std::
  _Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  ::~_Vector_base((_Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                   *)&mfi);
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((Soln->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this_00 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&mfi,this_00);
  local_6e8.super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
       (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
       mfi.m_fa._M_t.
       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
       super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  local_6f0 = (MultiCutFab *)mfi.fabArray;
  local_6f8 = (MultiCutFab *)mfi.tile_size.vect._0_8_;
  local_4c4.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_4c4.do_tiling = true;
  local_4c4.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_4c4.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_4c4.tilesize.vect[2] = DAT_007d7ef0;
  local_4c4.dynamic = true;
  local_4c4.device_sync = true;
  local_6d0 = Soln;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)Soln,&local_4c4);
  local_6d8 = local_780 + 1;
  if (ncomp < 1) {
    ncomp = 0;
  }
  uVar16 = (ulong)(uint)ncomp;
  local_6e0 = local_780 + 2;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_738,&flxx.super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_7c8,&flxy.super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_778,&flxz.super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::MFIter::nodaltilebox(&ubx,&mfi,0);
    amrex::MFIter::nodaltilebox(&vbx,&mfi,1);
    amrex::MFIter::nodaltilebox(&wbx,&mfi,2);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_688,local_780,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_6c8,local_6d8,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_648,local_6e0,&mfi);
    amrex::MFIter::tilebox(&bx,&mfi);
    piVar4 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar4 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this = (EBCellFlagFab *)
           (local_6d0->super_FabArray<amrex::FArrayBox>).m_fabs_v.
           super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
           super__Vector_impl_data._M_start[*piVar4][1].super_BaseFab<double>._vptr_BaseFab;
    result.bigend.vect[2] = bx.bigend.vect[2];
    result.btype.itype = bx.btype.itype;
    result.smallend.vect[0] = bx.smallend.vect[0];
    result.smallend.vect[1] = bx.smallend.vect[1];
    FVar3 = amrex::EBCellFlagFab::getType(this,&result);
    auVar2 = _DAT_006f8e90;
    auVar1 = _DAT_006f8e80;
    if (FVar3 == covered) {
      uVar8 = ubx.bigend.vect[0] - ubx.smallend.vect[0];
      auVar21._4_4_ = 0;
      auVar21._0_4_ = uVar8;
      auVar21._8_4_ = uVar8;
      auVar21._12_4_ = 0;
      lVar5 = 0;
      for (uVar7 = 0; lVar6 = (long)ubx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
        for (; (int)lVar6 <= ubx.bigend.vect[2]; lVar6 = lVar6 + 1) {
          lVar15 = (long)local_738.p +
                   local_738.nstride * lVar5 +
                   (lVar6 - local_738.begin.z) * local_738.kstride * 8 +
                   ((long)ubx.smallend.vect[1] - (long)local_738.begin.y) * local_738.jstride * 8 +
                   (long)local_738.begin.x * -8 + (long)ubx.smallend.vect[0] * 8 + 8;
          for (lVar14 = (long)ubx.smallend.vect[1]; lVar14 <= ubx.bigend.vect[1];
              lVar14 = lVar14 + 1) {
            if (ubx.smallend.vect[0] <= ubx.bigend.vect[0]) {
              uVar10 = 0;
              do {
                auVar19._8_4_ = (int)uVar10;
                auVar19._0_8_ = uVar10;
                auVar19._12_4_ = (int)(uVar10 >> 0x20);
                auVar23 = auVar21 ^ auVar2;
                auVar19 = (auVar19 | auVar1) ^ auVar2;
                if ((bool)(~(auVar19._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar19._0_4_ ||
                            auVar23._4_4_ < auVar19._4_4_) & 1)) {
                  *(undefined8 *)(lVar15 + -8 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                if (auVar19._12_4_ <= auVar23._12_4_ &&
                    (auVar19._12_4_ != auVar23._12_4_ || auVar19._8_4_ <= auVar23._8_4_)) {
                  *(undefined8 *)(lVar15 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                uVar10 = uVar10 + 2;
              } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar10);
            }
            lVar15 = lVar15 + local_738.jstride * 8;
          }
        }
        lVar5 = lVar5 + 8;
      }
      uVar8 = vbx.bigend.vect[0] - vbx.smallend.vect[0];
      auVar23._4_4_ = 0;
      auVar23._0_4_ = uVar8;
      auVar23._8_4_ = uVar8;
      auVar23._12_4_ = 0;
      auVar23 = auVar23 ^ auVar2;
      lVar5 = 0;
      for (uVar7 = 0; lVar6 = (long)vbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
        for (; (int)lVar6 <= vbx.bigend.vect[2]; lVar6 = lVar6 + 1) {
          lVar15 = (long)local_7c8.p +
                   local_7c8.nstride * lVar5 +
                   (lVar6 - local_7c8.begin.z) * local_7c8.kstride * 8 +
                   ((long)vbx.smallend.vect[1] - (long)local_7c8.begin.y) * local_7c8.jstride * 8 +
                   (long)local_7c8.begin.x * -8 + (long)vbx.smallend.vect[0] * 8 + 8;
          for (lVar14 = (long)vbx.smallend.vect[1]; lVar14 <= vbx.bigend.vect[1];
              lVar14 = lVar14 + 1) {
            if (vbx.smallend.vect[0] <= vbx.bigend.vect[0]) {
              uVar10 = 0;
              do {
                auVar20._8_4_ = (int)uVar10;
                auVar20._0_8_ = uVar10;
                auVar20._12_4_ = (int)(uVar10 >> 0x20);
                auVar21 = (auVar20 | auVar1) ^ auVar2;
                if ((bool)(~(auVar23._4_4_ < auVar21._4_4_ ||
                            auVar23._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar23._4_4_) & 1)) {
                  *(undefined8 *)(lVar15 + -8 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                if (auVar21._12_4_ <= auVar23._12_4_ &&
                    (auVar21._8_4_ <= auVar23._8_4_ || auVar21._12_4_ != auVar23._12_4_)) {
                  *(undefined8 *)(lVar15 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                uVar10 = uVar10 + 2;
              } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar10);
            }
            lVar15 = lVar15 + local_7c8.jstride * 8;
          }
        }
        lVar5 = lVar5 + 8;
      }
      uVar8 = wbx.bigend.vect[0] - wbx.smallend.vect[0];
      auVar18._4_4_ = 0;
      auVar18._0_4_ = uVar8;
      auVar18._8_4_ = uVar8;
      auVar18._12_4_ = 0;
      auVar18 = auVar18 ^ auVar2;
      lVar5 = 0;
      for (uVar7 = 0; lVar6 = (long)wbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
        for (; (int)lVar6 <= wbx.bigend.vect[2]; lVar6 = lVar6 + 1) {
          lVar15 = (long)local_778.p +
                   local_778.nstride * lVar5 +
                   (lVar6 - local_778.begin.z) * local_778.kstride * 8 +
                   ((long)wbx.smallend.vect[1] - (long)local_778.begin.y) * local_778.jstride * 8 +
                   (long)local_778.begin.x * -8 + (long)wbx.smallend.vect[0] * 8 + 8;
          for (lVar14 = (long)wbx.smallend.vect[1]; lVar14 <= wbx.bigend.vect[1];
              lVar14 = lVar14 + 1) {
            if (wbx.smallend.vect[0] <= wbx.bigend.vect[0]) {
              uVar10 = 0;
              do {
                auVar22._8_4_ = (int)uVar10;
                auVar22._0_8_ = uVar10;
                auVar22._12_4_ = (int)(uVar10 >> 0x20);
                auVar21 = (auVar22 | auVar1) ^ auVar2;
                if ((bool)(~(auVar18._4_4_ < auVar21._4_4_ ||
                            auVar18._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar18._4_4_) & 1)) {
                  *(undefined8 *)(lVar15 + -8 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                if (auVar21._12_4_ <= auVar18._12_4_ &&
                    (auVar21._8_4_ <= auVar18._8_4_ || auVar21._12_4_ != auVar18._12_4_)) {
                  *(undefined8 *)(lVar15 + uVar10 * 8) = 0x483d6329f1c35ca5;
                }
                uVar10 = uVar10 + 2;
              } while (((ulong)uVar8 + 2 & 0x1fffffffe) != uVar10);
            }
            lVar15 = lVar15 + local_778.jstride * 8;
          }
        }
        lVar5 = lVar5 + 8;
      }
    }
    else {
      result.bigend.vect[1] = bx.bigend.vect[1];
      result.bigend.vect[2] = bx.bigend.vect[2];
      result.btype.itype = bx.btype.itype;
      result.smallend.vect[0] = bx.smallend.vect[0];
      result.smallend.vect[1] = bx.smallend.vect[1];
      result.smallend.vect[2] = bx.smallend.vect[2];
      result.bigend.vect[0] = bx.bigend.vect[0];
      FVar3 = amrex::EBCellFlagFab::getType(this,&result);
      if (FVar3 == regular) {
        lVar5 = (long)ubx.smallend.vect[1];
        local_858 = 0;
        for (uVar7 = 0; lVar6 = (long)ubx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar6 <= ubx.bigend.vect[2]; lVar6 = lVar6 + 1) {
            lVar9 = (long)local_738.p +
                    local_738.nstride * local_858 +
                    (lVar5 - local_738.begin.y) * local_738.jstride * 8 +
                    (lVar6 - local_738.begin.z) * local_738.kstride * 8 +
                    (long)local_738.begin.x * -8 + (long)ubx.smallend.vect[0] * 8;
            lVar15 = (long)local_688.p +
                     (lVar5 - local_688.begin.y) * local_688.jstride * 8 +
                     (lVar6 - local_688.begin.z) * local_688.kstride * 8 +
                     (long)local_688.begin.x * -8 + (long)ubx.smallend.vect[0] * 8;
            for (lVar14 = lVar5; lVar14 <= ubx.bigend.vect[1]; lVar14 = lVar14 + 1) {
              if (ubx.smallend.vect[0] <= ubx.bigend.vect[0]) {
                lVar11 = 0;
                do {
                  *(double *)(lVar9 + lVar11 * 8) =
                       *(double *)(lVar15 + lVar11 * 8) * local_788 *
                       *(double *)(lVar9 + lVar11 * 8);
                  lVar11 = lVar11 + 1;
                } while ((ubx.bigend.vect[0] - ubx.smallend.vect[0]) + 1 != (int)lVar11);
              }
              lVar9 = lVar9 + local_738.jstride * 8;
              lVar15 = lVar15 + local_688.jstride * 8;
            }
          }
          local_858 = local_858 + 8;
        }
        lVar5 = (long)vbx.smallend.vect[1];
        local_858 = 0;
        for (uVar7 = 0; lVar6 = (long)vbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar6 <= vbx.bigend.vect[2]; lVar6 = lVar6 + 1) {
            lVar9 = (long)local_7c8.p +
                    local_7c8.nstride * local_858 +
                    (lVar5 - local_7c8.begin.y) * local_7c8.jstride * 8 +
                    (lVar6 - local_7c8.begin.z) * local_7c8.kstride * 8 +
                    (long)local_7c8.begin.x * -8 + (long)vbx.smallend.vect[0] * 8;
            lVar15 = (long)local_6c8.p +
                     (lVar5 - local_6c8.begin.y) * local_6c8.jstride * 8 +
                     (lVar6 - local_6c8.begin.z) * local_6c8.kstride * 8 +
                     (long)local_6c8.begin.x * -8 + (long)vbx.smallend.vect[0] * 8;
            for (lVar14 = lVar5; lVar14 <= vbx.bigend.vect[1]; lVar14 = lVar14 + 1) {
              if (vbx.smallend.vect[0] <= vbx.bigend.vect[0]) {
                lVar11 = 0;
                do {
                  *(double *)(lVar9 + lVar11 * 8) =
                       *(double *)(lVar15 + lVar11 * 8) * local_788 *
                       *(double *)(lVar9 + lVar11 * 8);
                  lVar11 = lVar11 + 1;
                } while ((vbx.bigend.vect[0] - vbx.smallend.vect[0]) + 1 != (int)lVar11);
              }
              lVar9 = lVar9 + local_7c8.jstride * 8;
              lVar15 = lVar15 + local_6c8.jstride * 8;
            }
          }
          local_858 = local_858 + 8;
        }
        lVar5 = (long)wbx.smallend.vect[1];
        local_858 = 0;
        for (uVar7 = 0; lVar6 = (long)wbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar6 <= wbx.bigend.vect[2]; lVar6 = lVar6 + 1) {
            lVar9 = (long)local_778.p +
                    local_778.nstride * local_858 +
                    (lVar5 - local_778.begin.y) * local_778.jstride * 8 +
                    (lVar6 - local_778.begin.z) * local_778.kstride * 8 +
                    (long)local_778.begin.x * -8 + (long)wbx.smallend.vect[0] * 8;
            lVar15 = (long)local_648.p +
                     (lVar5 - local_648.begin.y) * local_648.jstride * 8 +
                     (lVar6 - local_648.begin.z) * local_648.kstride * 8 +
                     (long)local_648.begin.x * -8 + (long)wbx.smallend.vect[0] * 8;
            for (lVar14 = lVar5; lVar14 <= wbx.bigend.vect[1]; lVar14 = lVar14 + 1) {
              if (wbx.smallend.vect[0] <= wbx.bigend.vect[0]) {
                lVar11 = 0;
                do {
                  *(double *)(lVar9 + lVar11 * 8) =
                       *(double *)(lVar15 + lVar11 * 8) * local_788 *
                       *(double *)(lVar9 + lVar11 * 8);
                  lVar11 = lVar11 + 1;
                } while ((wbx.bigend.vect[0] - wbx.smallend.vect[0]) + 1 != (int)lVar11);
              }
              lVar9 = lVar9 + local_778.jstride * 8;
              lVar15 = lVar15 + local_648.jstride * 8;
            }
          }
          local_858 = local_858 + 8;
        }
      }
      else {
        amrex::MultiCutFab::array
                  ((Array4<const_double> *)&result,
                   (MultiCutFab *)
                   local_6e8.
                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,&mfi);
        amrex::MultiCutFab::array(&local_508,local_6f0,&mfi);
        amrex::MultiCutFab::array(&local_548,local_6f8,&mfi);
        lVar5 = (long)ubx.smallend.vect[1];
        lVar6 = (long)ubx.smallend.vect[0] * 8;
        local_850 = 0;
        for (uVar7 = 0; lVar14 = (long)ubx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar14 <= ubx.bigend.vect[2]; lVar14 = lVar14 + 1) {
            lVar13 = (long)local_738.p +
                     local_738.nstride * local_850 +
                     (lVar5 - local_738.begin.y) * local_738.jstride * 8 +
                     (lVar14 - local_738.begin.z) * local_738.kstride * 8 +
                     (long)local_738.begin.x * -8 + lVar6;
            lVar17 = (long)local_688.p +
                     (lVar5 - local_688.begin.y) * local_688.jstride * 8 +
                     (lVar14 - local_688.begin.z) * local_688.kstride * 8 +
                     (long)local_688.begin.x * -8 + lVar6;
            lVar11 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
            lVar9 = (lVar5 - local_5c4) * lVar11 +
                    (lVar14 - local_5c0) * CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8
                    + (long)local_5c8 * -8 + result.smallend.vect._0_8_ + lVar6;
            for (lVar15 = lVar5; lVar15 <= ubx.bigend.vect[1]; lVar15 = lVar15 + 1) {
              if (ubx.smallend.vect[0] <= ubx.bigend.vect[0]) {
                lVar12 = 0;
                do {
                  *(double *)(lVar13 + lVar12 * 8) =
                       *(double *)(lVar17 + lVar12 * 8) * local_788 *
                       *(double *)(lVar9 + lVar12 * 8) * *(double *)(lVar13 + lVar12 * 8);
                  lVar12 = lVar12 + 1;
                } while ((ubx.bigend.vect[0] - ubx.smallend.vect[0]) + 1 != (int)lVar12);
              }
              lVar13 = lVar13 + local_738.jstride * 8;
              lVar17 = lVar17 + local_688.jstride * 8;
              lVar9 = lVar9 + lVar11;
            }
          }
          local_850 = local_850 + 8;
        }
        lVar5 = (long)vbx.smallend.vect[1];
        lVar6 = (long)vbx.smallend.vect[0] * 8;
        local_858 = 0;
        for (uVar7 = 0; lVar14 = (long)vbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar14 <= vbx.bigend.vect[2]; lVar14 = lVar14 + 1) {
            lVar17 = (long)local_7c8.p +
                     local_7c8.nstride * local_858 +
                     (lVar5 - local_7c8.begin.y) * local_7c8.jstride * 8 +
                     (lVar14 - local_7c8.begin.z) * local_7c8.kstride * 8 +
                     (long)local_7c8.begin.x * -8 + lVar6;
            lVar9 = (long)local_6c8.p +
                    (lVar5 - local_6c8.begin.y) * local_6c8.jstride * 8 +
                    (lVar14 - local_6c8.begin.z) * local_6c8.kstride * 8 +
                    (long)local_6c8.begin.x * -8 + lVar6;
            lVar11 = (long)local_508.p +
                     (lVar5 - local_508.begin.y) * local_508.jstride * 8 +
                     (lVar14 - local_508.begin.z) * local_508.kstride * 8 +
                     (long)local_508.begin.x * -8 + lVar6;
            for (lVar15 = lVar5; lVar15 <= vbx.bigend.vect[1]; lVar15 = lVar15 + 1) {
              if (vbx.smallend.vect[0] <= vbx.bigend.vect[0]) {
                lVar13 = 0;
                do {
                  *(double *)(lVar17 + lVar13 * 8) =
                       *(double *)(lVar9 + lVar13 * 8) * local_788 *
                       *(double *)(lVar11 + lVar13 * 8) * *(double *)(lVar17 + lVar13 * 8);
                  lVar13 = lVar13 + 1;
                } while ((vbx.bigend.vect[0] - vbx.smallend.vect[0]) + 1 != (int)lVar13);
              }
              lVar17 = lVar17 + local_7c8.jstride * 8;
              lVar9 = lVar9 + local_6c8.jstride * 8;
              lVar11 = lVar11 + local_508.jstride * 8;
            }
          }
          local_858 = local_858 + 8;
        }
        lVar5 = (long)wbx.smallend.vect[1];
        lVar6 = (long)wbx.smallend.vect[0] * 8;
        local_858 = 0;
        for (uVar7 = 0; lVar14 = (long)wbx.smallend.vect[2], uVar7 != uVar16; uVar7 = uVar7 + 1) {
          for (; (int)lVar14 <= wbx.bigend.vect[2]; lVar14 = lVar14 + 1) {
            lVar17 = (long)local_778.p +
                     local_778.nstride * local_858 +
                     (lVar5 - local_778.begin.y) * local_778.jstride * 8 +
                     (lVar14 - local_778.begin.z) * local_778.kstride * 8 +
                     (long)local_778.begin.x * -8 + lVar6;
            lVar9 = (long)local_648.p +
                    (lVar5 - local_648.begin.y) * local_648.jstride * 8 +
                    (lVar14 - local_648.begin.z) * local_648.kstride * 8 +
                    (long)local_648.begin.x * -8 + lVar6;
            lVar11 = (long)local_548.p +
                     (lVar5 - local_548.begin.y) * local_548.jstride * 8 +
                     (lVar14 - local_548.begin.z) * local_548.kstride * 8 +
                     (long)local_548.begin.x * -8 + lVar6;
            for (lVar15 = lVar5; lVar15 <= wbx.bigend.vect[1]; lVar15 = lVar15 + 1) {
              if (wbx.smallend.vect[0] <= wbx.bigend.vect[0]) {
                lVar13 = 0;
                do {
                  *(double *)(lVar17 + lVar13 * 8) =
                       *(double *)(lVar9 + lVar13 * 8) * local_788 *
                       *(double *)(lVar11 + lVar13 * 8) * *(double *)(lVar17 + lVar13 * 8);
                  lVar13 = lVar13 + 1;
                } while ((wbx.bigend.vect[0] - wbx.smallend.vect[0]) + 1 != (int)lVar13);
              }
              lVar17 = lVar17 + local_778.jstride * 8;
              lVar9 = lVar9 + local_648.jstride * 8;
              lVar11 = lVar11 + local_548.jstride * 8;
            }
          }
          local_858 = local_858 + 8;
        }
      }
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::MultiFab::~MultiFab(&flxz);
  amrex::MultiFab::~MultiFab(&flxy);
  amrex::MultiFab::~MultiFab(&flxx);
  return;
}

Assistant:

void
Diffusion::computeExtensiveFluxes(MLMG& a_mg, MultiFab& Soln,
                                  MultiFab* const* flux, const int fluxComp,
                                  const int ncomp, MultiFab* area,
                                  const Real fac )
{
   BL_ASSERT(flux[0]->nGrow()==0);

   AMREX_D_TERM(MultiFab flxx(*flux[0], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxy(*flux[1], amrex::make_alias, fluxComp, ncomp);,
                MultiFab flxz(*flux[2], amrex::make_alias, fluxComp, ncomp););
   std::array<MultiFab*,AMREX_SPACEDIM> fp{AMREX_D_DECL(&flxx,&flxy,&flxz)};

   a_mg.getFluxes({fp},{&Soln},MLLinOp::Location::FaceCentroid);

#ifdef AMREX_USE_EB
   auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Soln.Factory());
   Array< const MultiCutFab*,AMREX_SPACEDIM> areafrac;
   areafrac  = ebfactory.getAreaFrac();
#endif

   MFItInfo mfi_info;
   if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Soln, mfi_info); mfi.isValid(); ++mfi)
   {
      D_TERM( const auto& fx = flxx.array(mfi);,
              const auto& fy = flxy.array(mfi);,
              const auto& fz = flxz.array(mfi););

      D_TERM( const Box ubx = mfi.nodaltilebox(0);,
              const Box vbx = mfi.nodaltilebox(1);,
              const Box wbx = mfi.nodaltilebox(2););

      D_TERM( const auto& areax = area[0].array(mfi);,
              const auto& areay = area[1].array(mfi);,
              const auto& areaz = area[2].array(mfi););

#ifdef AMREX_USE_EB
      Box bx = mfi.tilebox();

      const EBFArrayBox&     cc_fab = static_cast<EBFArrayBox const&>(Soln[mfi]);
      const EBCellFlagFab&    flags = cc_fab.getEBCellFlagFab();

      if ( flags.getType(amrex::grow(bx,0)) == FabType::covered )
      {
         //
         // For now, set to very large num so we know if you accidentally use it
         // MLMG will set covered fluxes to zero
         //
         D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) = COVERED_VAL;});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) = COVERED_VAL;}););
      }
      else if ( flags.getType(amrex::grow(bx,0)) != FabType::regular )
      {
	 D_TERM( const auto& afrac_x = areafrac[0]->array(mfi);,
		 const auto& afrac_y = areafrac[1]->array(mfi);,
		 const auto& afrac_z = areafrac[2]->array(mfi););

	 D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k)*afrac_x(i,j,k);});,
		AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k)*afrac_y(i,j,k);});,
                AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k)*afrac_z(i,j,k);}););
      }
      else
#endif
      {
	D_TERM(AMREX_PARALLEL_FOR_4D(ubx, ncomp, i, j, k, n, {fx(i,j,k,n) *= fac*areax(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(vbx, ncomp, i, j, k, n, {fy(i,j,k,n) *= fac*areay(i,j,k);});,
	       AMREX_PARALLEL_FOR_4D(wbx, ncomp, i, j, k, n, {fz(i,j,k,n) *= fac*areaz(i,j,k);}););
      }
   }
}